

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::Assembler::embedLabel(Assembler *this,Label *label)

{
  Error EVar1;
  ulong uVar2;
  LabelLink *pLVar3;
  uint size;
  long in_RSI;
  CodeHolder *in_RDI;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  LabelLink *link;
  uint32_t gpSize;
  Error err;
  LabelEntry *le;
  RelocEntry *re;
  size_t index;
  char *in_stack_000002b0;
  int in_stack_000002bc;
  char *in_stack_000002c0;
  Logger *in_stack_fffffffffffffec8;
  RelocEntry **offset;
  CodeEmitter *in_stack_fffffffffffffed8;
  CodeEmitter *le_00;
  CodeHolder *in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffefc;
  RelocEntry **dst;
  CodeHolder *in_stack_ffffffffffffff08;
  Error local_dc;
  
  if (*(int *)((long)&in_RDI->_logger + 4) == 0) {
    if (in_RDI->_emitters == (CodeEmitter *)0x0) {
      DebugUtils::assertionFailed(in_stack_000002c0,in_stack_000002bc,in_stack_000002b0);
    }
    le_00 = in_RDI->_emitters;
    uVar2 = (ulong)(*(int *)(in_RSI + 4) - 0x100);
    if (uVar2 < le_00[2]._codeInfo._baseAddress) {
      in_stack_fffffffffffffed8 = (CodeEmitter *)&le_00[2]._codeInfo;
      if (le_00[2]._codeInfo._baseAddress <= uVar2) {
        DebugUtils::assertionFailed(in_stack_000002c0,in_stack_000002bc,in_stack_000002b0);
      }
      offset = *(RelocEntry ***)
                (*(long *)&((CodeInfo *)in_stack_fffffffffffffed8)->_archInfo + uVar2 * 8);
    }
    else {
      offset = (RelocEntry **)0x0;
    }
    if (offset == (RelocEntry **)0x0) {
      local_dc = CodeEmitter::setLastError
                           (in_stack_fffffffffffffed8,0,(char *)in_stack_fffffffffffffec8);
    }
    else {
      size = (uint)*(byte *)((long)&(in_RDI->_codeInfo)._baseAddress + 2);
      dst = offset;
      if ((ulong)((long)(in_RDI->_baseHeap)._slots[0] - (long)(in_RDI->_baseHeap)._slots[1]) <
          (ulong)size) {
        EVar1 = CodeHolder::growBuffer(in_stack_fffffffffffffef0,(CodeBuffer *)in_RDI,(size_t)le_00)
        ;
        if (EVar1 != 0) {
          EVar1 = CodeEmitter::setLastError
                            (in_stack_fffffffffffffed8,(Error)((ulong)offset >> 0x20),
                             (char *)in_stack_fffffffffffffec8);
          return EVar1;
        }
        in_stack_fffffffffffffefc = 0;
        in_XMM0_Da = extraout_XMM0_Da;
      }
      if ((in_RDI->_unresolvedLabelsCount & 4) != 0) {
        in_stack_fffffffffffffec8 = *(Logger **)&in_RDI->_emitters->_type;
        Logger::logf(in_stack_fffffffffffffec8,in_XMM0_Da);
      }
      EVar1 = CodeHolder::newRelocEntry
                        (in_stack_ffffffffffffff08,dst,in_stack_fffffffffffffefc,size);
      if (EVar1 == 0) {
        *(undefined4 *)&(in_stack_ffffffffffffff08->_codeInfo)._baseAddress =
             **(undefined4 **)&(in_RDI->_dataZone)._blockSize;
        *(long *)&in_stack_ffffffffffffff08->_globalHints =
             (long)(in_RDI->_baseHeap)._slots[1] - (long)(in_RDI->_baseHeap)._zone;
        if (*(int *)(dst + 3) == -1) {
          pLVar3 = CodeHolder::newLabelLink
                             (in_RDI,(LabelEntry *)le_00,
                              (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),(size_t)offset,
                              (intptr_t)in_stack_fffffffffffffec8);
          if (pLVar3 == (LabelLink *)0x0) {
            EVar1 = CodeEmitter::setLastError
                              (in_stack_fffffffffffffed8,(Error)((ulong)offset >> 0x20),
                               (char *)in_stack_fffffffffffffec8);
            return EVar1;
          }
          pLVar3->relocId = (uint32_t)(in_stack_ffffffffffffff08->_codeInfo)._archInfo.field_0;
        }
        else {
          *(undefined4 *)((long)&(in_stack_ffffffffffffff08->_codeInfo)._baseAddress + 4) =
               *(undefined4 *)(dst + 3);
          in_stack_ffffffffffffff08->_emitters = (CodeEmitter *)dst[4];
        }
        memset((in_RDI->_baseHeap)._slots[1],0,(ulong)size);
        (in_RDI->_baseHeap)._slots[1] =
             (Slot *)((long)&(in_RDI->_baseHeap)._slots[1]->next + (ulong)size);
        local_dc = 0;
      }
      else {
        local_dc = CodeEmitter::setLastError
                             (in_stack_fffffffffffffed8,(Error)((ulong)offset >> 0x20),
                              (char *)in_stack_fffffffffffffec8);
      }
    }
  }
  else {
    local_dc = *(Error *)((long)&in_RDI->_logger + 4);
  }
  return local_dc;
}

Assistant:

Error Assembler::embedLabel(const Label& label) {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  RelocEntry* re;
  LabelEntry* le = _code->getLabelEntry(label);

  if (ASMJIT_UNLIKELY(!le))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  Error err;
  uint32_t gpSize = getGpSize();

  if (getRemainingSpace() < gpSize) {
    err = _code->growBuffer(&_section->_buffer, gpSize);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logf(gpSize == 4 ? ".dd L%u\n" : ".dq L%u\n", Operand::unpackId(label.getId()));
#endif // !ASMJIT_DISABLE_LOGGING

  err = _code->newRelocEntry(&re, RelocEntry::kTypeRelToAbs, gpSize);
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  re->_sourceSectionId = _section->getId();
  re->_sourceOffset = static_cast<uint64_t>(getOffset());

  if (le->isBound()) {
    re->_targetSectionId = le->getSectionId();
    re->_data = static_cast<uint64_t>(static_cast<int64_t>(le->getOffset()));
  }
  else {
    LabelLink* link = _code->newLabelLink(le, _section->getId(), getOffset(), 0);
    if (ASMJIT_UNLIKELY(!link))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));
    link->relocId = re->getId();
  }

  // Emit dummy DWORD/QWORD depending on the address size.
  ::memset(_bufferPtr, 0, gpSize);
  _bufferPtr += gpSize;

  return kErrorOk;
}